

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

List<Path> * __thiscall
Path::files(List<Path> *__return_storage_ptr__,Path *this,uint filter,size_t max,bool recurse)

{
  size_t local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_48 = max;
  if (max != 0) {
    (__return_storage_ptr__->super_vector<Path,_std::allocator<Path>_>).
    super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (__return_storage_ptr__->super_vector<Path,_std::allocator<Path>_>).
    super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (__return_storage_ptr__->super_vector<Path,_std::allocator<Path>_>).
    super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_40._8_8_ = 0;
    local_40._M_unused._M_object = operator_new(0x20);
    *(uint *)local_40._M_unused._0_8_ = filter;
    *(size_t **)((long)local_40._M_unused._0_8_ + 8) = &local_48;
    *(bool *)((long)local_40._M_unused._0_8_ + 0x10) = recurse;
    *(List<Path> **)((long)local_40._M_unused._0_8_ + 0x18) = __return_storage_ptr__;
    local_28 = std::
               _Function_handler<Path::VisitResult_(const_Path_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp:788:11)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<Path::VisitResult_(const_Path_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp:788:11)>
               ::_M_manager;
    visit(this,(function<Path::VisitResult_(const_Path_&)> *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("max != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp",
                0x311,"List<Path> Path::files(unsigned int, size_t, bool) const");
}

Assistant:

List<Path> Path::files(unsigned int filter, size_t max, bool recurse) const
{
    assert(max != 0);

    List<Path> paths;
    visit([filter, &max, recurse, &paths](const Path &path) {
            if (max > 0)
                --max;
            if (path.type() & filter) {
                paths.append(path);
            }
            if (!max)
                return Path::Abort;
            return recurse ? Path::Recurse : Path::Continue;
        });
    return paths;
}